

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplesUtil.cpp
# Opt level: O3

int64_t aeron::archive::findLatestRecordingId
                  (AeronArchive *archive,string *channel,int32_t streamId)

{
  int32_t iVar1;
  ostream *poVar2;
  int64_t lastRecordingId;
  int64_t local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &local_38;
  local_38 = -1;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/samples/SamplesUtil.cpp:48:21)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/samples/SamplesUtil.cpp:48:21)>
             ::_M_manager;
  iVar1 = AeronArchive::listRecordingsForUri
                    (archive,0,100,channel,streamId,(RecordingDescriptorConsumer *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", last recording id = ",0x16);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    local_30._M_pod_data[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_30._M_pod_data,1);
  }
  return local_38;
}

Assistant:

std::int64_t findLatestRecordingId(aeron::archive::AeronArchive& archive, const std::string& channel,
                                   std::int32_t streamId) {
    std::int64_t lastRecordingId{-1};

    auto consumer = [&](long controlSessionId, long correlationId, long recordingId, long startTimestamp,
                        long stopTimestamp, long startPosition, long stopPosition, int initialTermId,
                        int segmentFileLength, int termBufferLength, int mtuLength, int sessionId, int streamId,
                        const std::string& strippedChannel, const std::string& originalChannel,
                        const std::string& sourceIdentity) {
        std::cout << "recId: " << recordingId << ", ts: [" << startTimestamp << ", " << stopTimestamp
                  << "], pos: [" << startPosition << ", " << stopPosition
                  << "], initialTermId: " << initialTermId << ", sessionId: " << sessionId << ", streamId: " << streamId
                  << ", strippedChannel: " << strippedChannel << ", originalChannel: " << originalChannel
                  << ", sourceIdentity: " << sourceIdentity << '\n';

        lastRecordingId = recordingId;
    };

    std::int32_t foundCount = archive.listRecordingsForUri(0, 100, channel, streamId, consumer);

    if (foundCount) {
        std::cout << "found " << foundCount << ", last recording id = " << lastRecordingId << '\n';
    }

    return lastRecordingId;
}